

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O3

void __thiscall spvtools::opt::SSAPropagator::Initialize(SSAPropagator *this,Function *fn)

{
  pointer *ppEVar1;
  IRContext *pIVar2;
  iterator iVar3;
  pointer puVar4;
  BasicBlock *this_00;
  pointer pEVar5;
  bool bVar6;
  mapped_type *pmVar7;
  value_type *const_block;
  Edge *e;
  pointer edge;
  pointer puVar8;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_68;
  _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_60 = (_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->bb_succs_;
  pIVar2 = this->ctx_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  local_68._M_head_impl =
       &((pIVar2->cfg_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
         super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_entry_block_;
  pmVar7 = std::__detail::
           _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](local_60,&local_68._M_head_impl);
  pIVar2 = this->ctx_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  Edge::Edge((Edge *)&local_58,
             &((pIVar2->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
              pseudo_entry_block_,
             (BasicBlock *)
             (((fn->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t);
  iVar3._M_current =
       (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::
    _M_realloc_insert<spvtools::opt::Edge>(pmVar7,iVar3,(Edge *)&local_58);
  }
  else {
    (iVar3._M_current)->source = (BasicBlock *)local_58._M_unused._0_8_;
    (iVar3._M_current)->dest = (BasicBlock *)local_58._8_8_;
    ppEVar1 = &(pmVar7->
               super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  puVar8 = (fn->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (fn->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar4) {
    local_38 = (_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->bb_preds_;
    do {
      this_00 = (puVar8->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      local_40 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:218:39)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:218:39)>
                 ::_M_manager;
      local_58._M_unused._M_object = this;
      local_58._8_8_ = this_00;
      BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int)> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      bVar6 = BasicBlock::IsReturnOrAbort(this_00);
      if (bVar6) {
        local_68._M_head_impl = this_00;
        pmVar7 = std::__detail::
                 _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_60,&local_68._M_head_impl);
        pIVar2 = this->ctx_;
        if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar2);
        }
        local_58._8_8_ =
             &((pIVar2->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_exit_block_
        ;
        iVar3._M_current =
             (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        local_58._M_unused._M_object = this_00;
        if (iVar3._M_current ==
            (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::
          _M_realloc_insert<spvtools::opt::Edge>(pmVar7,iVar3,(Edge *)&local_58);
        }
        else {
          (iVar3._M_current)->source = this_00;
          (iVar3._M_current)->dest = (BasicBlock *)local_58._8_8_;
          ppEVar1 = &(pmVar7->
                     super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppEVar1 = *ppEVar1 + 1;
        }
        pIVar2 = this->ctx_;
        if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar2);
        }
        local_68._M_head_impl =
             &((pIVar2->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_exit_block_
        ;
        pmVar7 = std::__detail::
                 _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_38,&local_68._M_head_impl);
        pIVar2 = this->ctx_;
        if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar2);
        }
        local_58._M_unused._M_object =
             &((pIVar2->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_exit_block_
        ;
        iVar3._M_current =
             (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_58._8_8_ = this_00;
          std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::
          _M_realloc_insert<spvtools::opt::Edge>(pmVar7,iVar3,(Edge *)&local_58);
        }
        else {
          (iVar3._M_current)->source = (BasicBlock *)local_58._M_unused._0_8_;
          (iVar3._M_current)->dest = this_00;
          ppEVar1 = &(pmVar7->
                     super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppEVar1 = *ppEVar1 + 1;
          local_58._8_8_ = this_00;
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar4);
  }
  pIVar2 = this->ctx_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  local_58._M_unused._M_object =
       &((pIVar2->cfg_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
         super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_entry_block_;
  pmVar7 = std::__detail::
           _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](local_60,(key_type *)&local_58);
  pEVar5 = (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (edge = (pmVar7->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>
              )._M_impl.super__Vector_impl_data._M_start; edge != pEVar5; edge = edge + 1) {
    AddControlEdge(this,edge);
  }
  return;
}

Assistant:

void SSAPropagator::Initialize(Function* fn) {
  // Compute predecessor and successor blocks for every block in |fn|'s CFG.
  // TODO(dnovillo): Move this to CFG and always build them. Alternately,
  // move it to IRContext and build CFG preds/succs on-demand.
  bb_succs_[ctx_->cfg()->pseudo_entry_block()].push_back(
      Edge(ctx_->cfg()->pseudo_entry_block(), fn->entry().get()));

  for (auto& block : *fn) {
    const auto& const_block = block;
    const_block.ForEachSuccessorLabel([this, &block](const uint32_t label_id) {
      BasicBlock* succ_bb =
          ctx_->get_instr_block(get_def_use_mgr()->GetDef(label_id));
      bb_succs_[&block].push_back(Edge(&block, succ_bb));
      bb_preds_[succ_bb].push_back(Edge(succ_bb, &block));
    });
    if (block.IsReturnOrAbort()) {
      bb_succs_[&block].push_back(
          Edge(&block, ctx_->cfg()->pseudo_exit_block()));
      bb_preds_[ctx_->cfg()->pseudo_exit_block()].push_back(
          Edge(ctx_->cfg()->pseudo_exit_block(), &block));
    }
  }

  // Add the edges out of the entry block to seed the propagator.
  const auto& entry_succs = bb_succs_[ctx_->cfg()->pseudo_entry_block()];
  for (const auto& e : entry_succs) {
    AddControlEdge(e);
  }
}